

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void vkt::memory::anon_unknown_0::queueRun
               (DeviceInterface *vkd,VkQueue queue,VkCommandBuffer commandBuffer)

{
  VkResult VVar1;
  VkSubmitInfo submitInfo;
  VkCommandBuffer local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  VkCommandBuffer *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_38 = &local_70;
  uStack_60 = 0;
  local_48 = 0;
  uStack_30 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_28 = 0;
  local_68 = 4;
  uStack_40 = 1;
  local_70 = commandBuffer;
  VVar1 = (*vkd->_vptr_DeviceInterface[2])(vkd,queue,1,&local_68,0);
  ::vk::checkResult(VVar1,"vkd.queueSubmit(queue, 1, &submitInfo, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x2a8);
  VVar1 = (*vkd->_vptr_DeviceInterface[3])(vkd,queue);
  ::vk::checkResult(VVar1,"vkd.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x2a9);
  return;
}

Assistant:

void queueRun (const vk::DeviceInterface&	vkd,
			   vk::VkQueue					queue,
			   vk::VkCommandBuffer			commandBuffer)
{
	const vk::VkSubmitInfo	submitInfo	=
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,

		0,
		DE_NULL,
		(const vk::VkPipelineStageFlags*)DE_NULL,

		1,
		&commandBuffer,

		0,
		DE_NULL
	};

	VK_CHECK(vkd.queueSubmit(queue, 1, &submitInfo, 0));
	VK_CHECK(vkd.queueWaitIdle(queue));
}